

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Character * __thiscall World::GetCharacterReal(World *this,string *real_name)

{
  pointer ppCVar1;
  size_t sVar2;
  Character *pCVar3;
  size_t __n;
  int iVar4;
  pointer ppCVar5;
  bool bVar6;
  string local_50;
  
  util::lowercase(&local_50,real_name);
  std::__cxx11::string::operator=((string *)real_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppCVar5 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  if (ppCVar5 != ppCVar1) {
    sVar2 = real_name->_M_string_length;
    do {
      pCVar3 = *ppCVar5;
      __n = (pCVar3->real_name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar4 = bcmp((pCVar3->real_name)._M_dataplus._M_p,(real_name->_M_dataplus)._M_p,__n);
          bVar6 = iVar4 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        return pCVar3;
      }
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != ppCVar1);
  }
  return (Character *)0x0;
}

Assistant:

Character *World::GetCharacterReal(std::string real_name)
{
	real_name = util::lowercase(real_name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->real_name == real_name)
		{
			return character;
		}
	}

	return 0;
}